

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O1

_Bool i2p_dest_sign(i2p_privkeybuf *priv,uint8_t *buf,size_t sz,uint8_t *sig)

{
  _Bool _Var1;
  
  if (priv->sigtype == 0) {
    _Var1 = i2p_dsa_sign(&priv->dsa,buf,sz,sig);
    return _Var1;
  }
  if (priv->sigtype == 7) {
    _Var1 = i2p_eddsa_sign(&priv->eddsa,buf,sz,sig);
    return _Var1;
  }
  return false;
}

Assistant:

bool i2p_dest_sign(struct i2p_privkeybuf * priv, const uint8_t * buf, size_t sz, uint8_t * sig)
{
  switch(priv->sigtype)
  {
  case EDDSA_KEYTYPE:
    return i2p_eddsa_sign(&priv->eddsa, buf, sz, sig);
  case DSA_KEYTYPE:
    return i2p_dsa_sign(&priv->dsa, buf, sz, sig);
  default:
    return false;
  }
}